

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2_smpl.c
# Opt level: O0

int ossl_ec_GF2m_simple_point_copy(EC_POINT *dest,EC_POINT *src)

{
  BIGNUM *pBVar1;
  long in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  pBVar1 = BN_copy(*(BIGNUM **)(in_RDI + 0x10),*(BIGNUM **)(in_RSI + 0x10));
  if (pBVar1 == (BIGNUM *)0x0) {
    local_4 = 0;
  }
  else {
    pBVar1 = BN_copy(*(BIGNUM **)(in_RDI + 0x18),*(BIGNUM **)(in_RSI + 0x18));
    if (pBVar1 == (BIGNUM *)0x0) {
      local_4 = 0;
    }
    else {
      pBVar1 = BN_copy(*(BIGNUM **)(in_RDI + 0x20),*(BIGNUM **)(in_RSI + 0x20));
      if (pBVar1 == (BIGNUM *)0x0) {
        local_4 = 0;
      }
      else {
        *(undefined4 *)(in_RDI + 0x28) = *(undefined4 *)(in_RSI + 0x28);
        *(undefined4 *)(in_RDI + 8) = *(undefined4 *)(in_RSI + 8);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int ossl_ec_GF2m_simple_point_copy(EC_POINT *dest, const EC_POINT *src)
{
    if (!BN_copy(dest->X, src->X))
        return 0;
    if (!BN_copy(dest->Y, src->Y))
        return 0;
    if (!BN_copy(dest->Z, src->Z))
        return 0;
    dest->Z_is_one = src->Z_is_one;
    dest->curve_name = src->curve_name;

    return 1;
}